

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  ushort uVar1;
  size_t sVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  ushort uVar5;
  bool bVar6;
  runtime_error *this_00;
  char *pcVar7;
  const_iterator __pos;
  CZString key;
  value_type defaultValue;
  CZString local_a8;
  undefined4 local_94;
  pair<const_Json::Value::CZString,_Json::Value> local_90;
  ValueHolder local_58;
  undefined4 local_50;
  undefined8 local_48;
  size_t sStack_40;
  size_t local_38;
  
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 == '\0') {
    local_94 = 0;
    uVar5 = (ushort)local_50 & 0xfe00;
    local_48 = 0;
    sStack_40 = 0;
    local_38 = 0;
    local_50._0_2_ = uVar5 + 6;
    pcVar7 = (char *)operator_new(0x30);
    pcVar7[0x10] = '\0';
    pcVar7[0x11] = '\0';
    pcVar7[0x12] = '\0';
    pcVar7[0x13] = '\0';
    pcVar7[0x14] = '\0';
    pcVar7[0x15] = '\0';
    pcVar7[0x16] = '\0';
    pcVar7[0x17] = '\0';
    pcVar7[0x18] = '\0';
    pcVar7[0x19] = '\0';
    pcVar7[0x1a] = '\0';
    pcVar7[0x1b] = '\0';
    pcVar7[0x1c] = '\0';
    pcVar7[0x1d] = '\0';
    pcVar7[0x1e] = '\0';
    pcVar7[0x1f] = '\0';
    pcVar7[0x20] = '\0';
    pcVar7[0x21] = '\0';
    pcVar7[0x22] = '\0';
    pcVar7[0x23] = '\0';
    pcVar7[0x24] = '\0';
    pcVar7[0x25] = '\0';
    pcVar7[0x26] = '\0';
    pcVar7[0x27] = '\0';
    pcVar7[0x28] = '\0';
    pcVar7[0x29] = '\0';
    pcVar7[0x2a] = '\0';
    pcVar7[0x2b] = '\0';
    pcVar7[0x2c] = '\0';
    pcVar7[0x2d] = '\0';
    pcVar7[0x2e] = '\0';
    pcVar7[0x2f] = '\0';
    pcVar7[0] = '\0';
    pcVar7[1] = '\0';
    pcVar7[2] = '\0';
    pcVar7[3] = '\0';
    pcVar7[4] = '\0';
    pcVar7[5] = '\0';
    pcVar7[6] = '\0';
    pcVar7[7] = '\0';
    pcVar7[8] = '\0';
    pcVar7[9] = '\0';
    pcVar7[10] = '\0';
    pcVar7[0xb] = '\0';
    pcVar7[0xc] = '\0';
    pcVar7[0xd] = '\0';
    pcVar7[0xe] = '\0';
    pcVar7[0xf] = '\0';
    *(char **)(pcVar7 + 0x18) = pcVar7 + 8;
    *(char **)(pcVar7 + 0x20) = pcVar7 + 8;
    pcVar7[0x28] = '\0';
    pcVar7[0x29] = '\0';
    pcVar7[0x2a] = '\0';
    pcVar7[0x2b] = '\0';
    pcVar7[0x2c] = '\0';
    pcVar7[0x2d] = '\0';
    pcVar7[0x2e] = '\0';
    pcVar7[0x2f] = '\0';
    *(ushort *)&this->field_0x8 = uVar1 & 0xff00 | 6;
    local_58 = this->value_;
    (this->value_).string_ = pcVar7;
    *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | 6;
    local_50 = CONCAT22(local_50._2_2_,uVar1 & 0x100 | uVar5 + (short)local_94);
    sVar2 = this->start_;
    this->start_ = sStack_40;
    sVar3 = this->limit_;
    this->limit_ = local_38;
    sStack_40 = sVar2;
    local_38 = sVar3;
    ~Value((Value *)&local_58);
  }
  else if ((char)uVar1 != '\x06') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"in Json::Value::operator[](ArrayIndex): requires arrayValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a8.cstr_ = (char *)0x0;
  __pos._M_node = &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_a8.index_ = index;
  for (p_Var4 = (((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[bVar6]) {
    bVar6 = CZString::operator<((CZString *)(p_Var4 + 1),&local_a8);
    if (!bVar6) {
      __pos._M_node = p_Var4;
    }
  }
  if (((_Rb_tree_header *)__pos._M_node ==
       &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) ||
     (bVar6 = CZString::operator==((CZString *)(__pos._M_node + 1),&local_a8), !bVar6)) {
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              (&local_90,&local_a8,(Value *)kNull);
    __pos._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
         ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                   ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                     *)(this->value_).map_,__pos,&local_90);
    ~Value(&local_90.second);
    if ((local_90.first.cstr_ != (char *)0x0) && (local_90.first.index_ == 1)) {
      free(local_90.first.cstr_);
    }
  }
  if ((local_a8.cstr_ != (char *)0x0) && (local_a8.index_ == 1)) {
    free(local_a8.cstr_);
  }
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::operator[](ArrayIndex index) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == arrayValue,
      "in Json::Value::operator[](ArrayIndex): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  CZString key(index);
  ObjectValues::iterator it = value_.map_->lower_bound(key);
  if (it != value_.map_->end() && (*it).first == key)
    return (*it).second;

  ObjectValues::value_type defaultValue(key, null);
  it = value_.map_->insert(it, defaultValue);
  return (*it).second;
#else
  return value_.array_->resolveReference(index);
#endif
}